

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

Tetris * __thiscall Tetris::set(Tetris *this,int x,int y,int o)

{
  if (x == -1) {
    x = this->blockX;
  }
  this->blockX = x;
  if (y == -1) {
    y = this->blockY;
  }
  this->blockY = y;
  if (o == -1) {
    o = this->orientation;
  }
  this->orientation = o;
  return this;
}

Assistant:

Tetris &Tetris::set(int x, int y, int o)
{
    blockX = x == -1 ? blockX : x;
    blockY = y == -1 ? blockY : y;
    orientation = o == -1 ? orientation : o;
    return *this;
}